

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64_xo(char *s,size_t len)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint64_t uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar10 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                   (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar10 >> 0x2f ^ uVar10) * -0x651e95c4d06fbfb1;
        }
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar10 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
        uVar10 = (uVar10 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar10) * lVar6;
        uVar10 = uVar10 >> 0x2f ^ uVar10;
      }
      else {
        uVar10 = *(ulong *)(s + (len - 8));
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar2 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar3 = ((uVar2 >> 0x19 | uVar2 << 0x27) + uVar10) * lVar6;
        uVar10 = ((uVar10 >> 0x25 | uVar10 << 0x1b) * lVar6 + uVar2 ^ uVar3) * lVar6;
        uVar10 = (uVar10 >> 0x2f ^ uVar3 ^ uVar10) * lVar6;
        uVar10 = uVar10 >> 0x2f ^ uVar10;
      }
    }
    else {
      lVar6 = len * 2 + -0x651e95c4d06fbfb1;
      uVar3 = *(long *)(s + (len - 8)) * lVar6;
      uVar10 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
      uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar3;
      uVar10 = ((uVar3 >> 0x1e | uVar3 << 0x22) + (uVar10 >> 0x2b | uVar10 * 0x200000) +
                *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar2) * lVar6;
      uVar10 = (uVar10 >> 0x2f ^ uVar2 ^ uVar10) * lVar6;
      uVar10 = uVar10 >> 0x2f ^ uVar10;
    }
LAB_0017f2c3:
    return uVar10 * lVar6;
  }
  if (len < 0x41) {
    lVar6 = len * 2 + -0x651e95c4d06fbfcf;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(s + (len - 0x20));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)s;
    auVar23 = vpunpcklqdq_avx(auVar23,auVar25);
    auVar24._8_8_ = 0xb492b66fbe98f273;
    auVar24._0_8_ = 0xb492b66fbe98f273;
    auVar19 = vpmullq_avx512vl(auVar23,auVar24);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)(s + 0x10);
    auVar23 = vpunpcklqdq_avx(auVar21,auVar22);
    auVar28._8_8_ = 0x9ae16a3b2f90404f;
    auVar28._0_8_ = 0x9ae16a3b2f90404f;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)(s + (len - 0x18));
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)(s + 8);
    auVar24 = vpunpcklqdq_avx(auVar29,auVar30);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)(s + (len - 8));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(s + 0x18);
    auVar27 = vpunpcklqdq_avx(auVar27,auVar20);
    auVar26._8_8_ = 0x9ae16a3b2f904031;
    auVar26._0_8_ = 0x9ae16a3b2f904031;
    auVar20 = vpmullq_avx512vl(auVar23,auVar28);
    auVar23 = vpaddq_avx(auVar24,auVar28);
    auVar21 = vprolq_avx512vl(auVar23,0x2e);
    auVar23 = vpaddq_avx(auVar19,auVar24);
    auVar22 = vprolq_avx512vl(auVar23,0x15);
    auVar25 = vpinsrq_avx(auVar26,lVar6,0);
    auVar23 = vpmullq_avx512vl(auVar27,auVar25);
    auVar24 = vprolq_avx512vl(auVar23,0x22);
    auVar23 = vpaddq_avx(auVar21,auVar23);
    auVar23 = vpaddq_avx(auVar23,auVar19);
    auVar24 = vpaddq_avx(auVar24,auVar20);
    auVar24 = vpaddq_avx(auVar24,auVar22);
    auVar24 = vpmullq_avx512vl(auVar24 ^ auVar23,auVar25);
    auVar27 = vpsrlq_avx(auVar24,0x2f);
    auVar23 = vpternlogq_avx512vl(auVar27,auVar23,auVar24,0x96);
    auVar23 = vpmullq_avx512vl(auVar23,auVar25);
    auVar24 = vpsrlq_avx(auVar23,0x2f);
    lVar4 = vpextrq_avx(auVar24 ^ auVar23,1);
    uVar10 = lVar4 + SUB168(auVar24 ^ auVar23,0) * lVar6;
    goto LAB_0017f2c3;
  }
  if (len < 0x61) {
    lVar6 = len * 2 + -0x651e95c4d06fc023;
    uVar2 = *(long *)(s + 0x18) * -0x651e95c4d06fc023;
    uVar10 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar3 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar3 = (uVar3 >> 0x12 | uVar3 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
    uVar10 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar10 >> 0x2b | uVar10 * 0x200000) +
              *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 ^ uVar3) * -0x651e95c4d06fc023;
    uVar18 = *(long *)(s + 0x38) * lVar6;
    uVar3 = (uVar10 >> 0x2f ^ uVar3 ^ uVar10) * -0x651e95c4d06fc023;
    uVar10 = *(long *)(s + 0x20) * -0x4b6d499041670d8d + *(long *)(s + 0x28);
    uVar2 = *(long *)(s + 0x28) + 0x9ae16a3b2f90404f;
    uVar15 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)(s + 0x20) * -0x4b6d499041670d8d + uVar18;
    uVar2 = *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + *(long *)(s + (len - 0x18));
    uVar9 = *(long *)(s + (len - 0x18)) + 0x9ae16a3b2f90404f;
    uVar10 = ((uVar18 >> 0x1e | uVar18 << 0x22) + (uVar10 >> 0x2b | uVar10 * 0x200000) +
              *(long *)(s + 0x30) * -0x651e95c4d06fbfb1 ^ uVar15) * lVar6;
    uVar18 = *(long *)(s + (len - 8)) * lVar6;
    uVar10 = (uVar10 >> 0x2f ^ uVar15 ^ uVar10) * lVar6;
    uVar9 = (uVar9 >> 0x12 | uVar9 << 0x2e) + *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d +
            uVar18 + (uVar10 >> 0x2f ^ uVar10);
    uVar2 = ((uVar18 >> 0x1e | uVar18 << 0x22) + (uVar2 >> 0x2b | uVar2 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 + (uVar3 >> 0x2f ^ uVar3) ^ uVar9) *
            lVar6;
    uVar2 = (uVar2 >> 0x2f ^ uVar9 ^ uVar2) * lVar6;
    return ((uVar10 >> 0x15) + (uVar3 >> 0x11) + (uVar2 >> 0x2f ^ uVar2) * 9) * lVar6;
  }
  if (0x100 < len) {
    uVar5 = farmhash64_uo(s,len);
    return uVar5;
  }
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar10 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                   (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar10 >> 0x2f ^ uVar10) * -0x651e95c4d06fbfb1;
        }
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar10 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
        uVar10 = (uVar10 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar10) * lVar6;
        uVar10 = uVar10 >> 0x2f ^ uVar10;
      }
      else {
        uVar10 = *(ulong *)(s + (len - 8));
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar2 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar3 = ((uVar2 >> 0x19 | uVar2 << 0x27) + uVar10) * lVar6;
        uVar10 = ((uVar10 >> 0x25 | uVar10 << 0x1b) * lVar6 + uVar2 ^ uVar3) * lVar6;
        uVar10 = (uVar10 >> 0x2f ^ uVar3 ^ uVar10) * lVar6;
        uVar10 = uVar10 >> 0x2f ^ uVar10;
      }
      goto LAB_0017e956;
    }
    lVar6 = len * 2 + -0x651e95c4d06fbfb1;
    uVar2 = *(long *)(s + (len - 8)) * lVar6;
    uVar10 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar3 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar10 = (uVar2 >> 0x1e | uVar2 << 0x22) + (uVar10 >> 0x2b | uVar10 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar2 = (uVar3 >> 0x12 | uVar3 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
  }
  else {
    if (0x40 < len) {
      uVar2 = len - 1 & 0xffffffffffffffc0;
      uVar10 = (ulong)((uint)(len - 1) & 0x3f);
      if (s + (len - 0x40) == s + (uVar10 - 0x3f) + uVar2) {
        lVar12 = *(long *)s + 0x1529cba0ca458ff;
        lVar6 = uVar10 + uVar2;
        lVar13 = 0x226bb95b4e64b6d4;
        uVar9 = 0x134a747f856d0526;
        uVar15 = 0;
        lVar11 = 0;
        uVar3 = 0;
        lVar17 = 0;
        lVar4 = 0;
        do {
          lVar1 = uVar15 + 0x10;
          lVar8 = lVar4 * -0x4b6d499041670d8d + *(long *)(s + uVar15);
          uVar14 = lVar13 + lVar4 + *(long *)(s + uVar15 + 0x30);
          uVar18 = lVar12 + lVar17 + lVar13 + *(long *)(s + uVar15 + 8);
          uVar16 = *(long *)(s + uVar15 + 8) + lVar8 + *(long *)(s + lVar1);
          lVar13 = lVar17 + *(long *)(s + uVar15 + 0x28) +
                   (uVar14 >> 0x2a | uVar14 * 0x400000) * -0x4b6d499041670d8d;
          lVar12 = (uVar9 + lVar11 >> 0x21 | (uVar9 + lVar11) * 0x80000000) * -0x4b6d499041670d8d;
          uVar9 = (uVar18 >> 0x25 | uVar18 * 0x8000000) * -0x4b6d499041670d8d ^ uVar3;
          lVar7 = uVar3 + lVar12 + *(long *)(s + uVar15 + 0x20);
          lVar17 = uVar16 + *(long *)(s + uVar15 + 0x18);
          uVar3 = lVar11 + lVar8 + *(long *)(s + uVar15 + 0x18) + uVar9;
          lVar4 = lVar8 + (uVar16 >> 0x2c | uVar16 * 0x100000) + (uVar3 >> 0x15 | uVar3 << 0x2b);
          lVar11 = uVar15 + 0x38;
          uVar3 = *(long *)(s + uVar15 + 0x28) + *(long *)(s + uVar15 + 0x30) + lVar7;
          uVar15 = uVar15 + 0x40;
          uVar18 = *(long *)(s + lVar1) + lVar7 + lVar13 + *(long *)(s + lVar11);
          lVar11 = uVar3 + *(long *)(s + lVar11);
          uVar3 = lVar7 + (uVar3 >> 0x2c | uVar3 * 0x100000) + (uVar18 >> 0x15 | uVar18 << 0x2b);
        } while (uVar2 != uVar15);
        lVar1 = (uVar9 & 0xff) * 2 + -0x4b6d499041670d8d;
        lVar17 = lVar17 + lVar11 + uVar10;
        lVar7 = lVar4 * lVar1 + *(long *)(s + lVar6 + -0x3f);
        lVar11 = lVar11 + uVar10 + lVar17;
        uVar9 = uVar9 + lVar11;
        uVar2 = lVar13 + lVar4 + *(long *)(s + lVar6 + -0xf);
        uVar10 = lVar12 + lVar13 + *(long *)(s + lVar6 + -0x37) + lVar17;
        uVar14 = *(long *)(s + lVar6 + -0x37) + *(long *)(s + lVar6 + -0x2f) + lVar7;
        uVar18 = lVar17 * 9 + *(long *)(s + lVar6 + -0x17) +
                 (uVar2 >> 0x2a | uVar2 * 0x400000) * lVar1;
        uVar15 = uVar3 * 9 ^ (uVar10 >> 0x25 | uVar10 * 0x8000000) * lVar1;
        uVar9 = uVar9 >> 0x21 | uVar9 * 0x80000000;
        lVar4 = uVar9 * lVar1 + uVar3 + *(long *)(s + lVar6 + -0x1f);
        uVar3 = lVar11 + lVar7 + uVar15 + *(long *)(s + lVar6 + -0x27);
        uVar10 = *(long *)(s + lVar6 + -0x17) + *(long *)(s + lVar6 + -0xf) + lVar4;
        uVar2 = uVar10 + *(long *)(s + lVar6 + -7);
        uVar16 = *(long *)(s + lVar6 + -0x2f) + uVar18 + *(long *)(s + lVar6 + -7) + lVar4;
        uVar10 = (uVar10 >> 0x2c | uVar10 * 0x100000) + lVar4 + (uVar16 >> 0x15 | uVar16 << 0x2b);
        uVar16 = (uVar14 + *(long *)(s + lVar6 + -0x27) ^ uVar2) * lVar1;
        uVar3 = ((uVar14 >> 0x2c | uVar14 * 0x100000) + lVar7 + (uVar3 >> 0x15 | uVar3 << 0x2b) ^
                uVar10) * lVar1;
        uVar2 = (uVar16 >> 0x2f ^ uVar2 ^ uVar16) * lVar1;
        uVar10 = (uVar3 >> 0x2f ^ uVar10 ^ uVar3) * lVar1;
        uVar10 = ((uVar10 >> 0x2f ^ uVar10) + uVar9) * lVar1;
        uVar2 = ((uVar18 >> 0x2f ^ uVar18) * -0x3c5a37a36834ced9 + uVar15 +
                 (uVar2 >> 0x2f ^ uVar2) * lVar1 ^ uVar10) * lVar1;
        uVar10 = (uVar2 >> 0x2f ^ uVar10 ^ uVar2) * lVar1;
        return (uVar10 >> 0x2f ^ uVar10) * lVar1;
      }
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash-c.c"
                    ,0x1b1,"uint64_t farmhash64_na(const char *, size_t)");
    }
    lVar6 = len * 2 + -0x651e95c4d06fbfb1;
    lVar4 = *(long *)s * -0x651e95c4d06fbfb1;
    uVar3 = *(long *)(s + (len - 8)) * lVar6;
    uVar10 = lVar4 + *(long *)(s + 8);
    uVar9 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar2 = lVar4 + *(long *)(s + 0x18);
    uVar10 = (uVar3 >> 0x1e | uVar3 << 0x22) + (uVar10 >> 0x2b | uVar10 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar3 = (uVar9 >> 0x12 | uVar9 << 0x2e) + lVar4 + uVar3;
    uVar9 = (uVar10 ^ uVar3) * lVar6;
    uVar15 = (uVar10 + *(long *)(s + (len - 0x20))) * lVar6;
    uVar10 = *(long *)(s + 0x10) * lVar6 + *(long *)(s + 0x18);
    uVar3 = (uVar9 >> 0x2f ^ uVar3 ^ uVar9) * lVar6;
    uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)(s + 0x10) * lVar6 + uVar15;
    uVar10 = (uVar15 >> 0x1e | uVar15 << 0x22) + (uVar10 >> 0x2b | uVar10 * 0x200000) +
             ((uVar3 >> 0x2f ^ uVar3) * lVar6 + *(long *)(s + (len - 0x18))) * lVar6;
  }
  uVar10 = (uVar10 ^ uVar2) * lVar6;
  uVar10 = (uVar10 >> 0x2f ^ uVar2 ^ uVar10) * lVar6;
  uVar10 = uVar10 >> 0x2f ^ uVar10;
LAB_0017e956:
  return uVar10 * lVar6;
}

Assistant:

uint64_t farmhash64_xo(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_xo_len_33_to_64(s, len);
  } else if (len <= 96) {
    return farmhash_xo_len_65_to_96(s, len);
  } else if (len <= 256) {
    return farmhash64_na(s, len);
  } else {
    return farmhash64_uo(s, len);
  }
}